

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O1

int secp256k1_eckey_pubkey_tweak_mul
              (secp256k1_ecmult_context *ctx,secp256k1_ge *key,secp256k1_scalar *tweak)

{
  secp256k1_scalar zero;
  secp256k1_gej pt;
  secp256k1_scalar local_b8;
  secp256k1_gej local_98;
  
  if (((tweak->d[1] != 0 || tweak->d[0] != 0) || tweak->d[2] != 0) || tweak->d[3] != 0) {
    local_b8.d[2] = 0;
    local_b8.d[3] = 0;
    local_b8.d[0] = 0;
    local_b8.d[1] = 0;
    local_98.infinity = key->infinity;
    local_98.x.n[0] = (key->x).n[0];
    local_98.x.n[1] = (key->x).n[1];
    local_98.x.n[2] = (key->x).n[2];
    local_98.x.n[3] = (key->x).n[3];
    local_98.x.n[4] = (key->x).n[4];
    local_98.y.n[0] = (key->y).n[0];
    local_98.y.n[1] = (key->y).n[1];
    local_98.y.n[2] = (key->y).n[2];
    local_98.y.n[3] = (key->y).n[3];
    local_98.y.n[4] = (key->y).n[4];
    local_98.z.n[0] = 1;
    local_98.z.n[1] = 0;
    local_98.z.n[2] = 0;
    local_98.z.n[3] = 0;
    local_98.z.n[4] = 0;
    secp256k1_ecmult(ctx,&local_98,&local_98,tweak,&local_b8);
    secp256k1_ge_set_gej(key,&local_98);
    return 1;
  }
  return 0;
}

Assistant:

SECP256K1_INLINE static int secp256k1_scalar_is_zero(const secp256k1_scalar *a) {
    return (a->d[0] | a->d[1] | a->d[2] | a->d[3]) == 0;
}